

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::~MembraneCallContextHook
          (MembraneCallContextHook *this)

{
  MembranePolicy *pMVar1;
  Disposer *pDVar2;
  CallContextHook *pCVar3;
  
  pMVar1 = (this->policy).ptr;
  if (pMVar1 != (MembranePolicy *)0x0) {
    (this->policy).ptr = (MembranePolicy *)0x0;
    pDVar2 = (this->policy).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pMVar1->_vptr_MembranePolicy + (long)pMVar1->_vptr_MembranePolicy[-2])
              );
  }
  pCVar3 = (this->inner).ptr;
  if (pCVar3 != (CallContextHook *)0x0) {
    (this->inner).ptr = (CallContextHook *)0x0;
    pDVar2 = (this->inner).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar3->_vptr_CallContextHook[-2] + (long)&pCVar3->_vptr_CallContextHook);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0xd0);
  return;
}

Assistant:

class MembraneCallContextHook final: public CallContextHook, public kj::Refcounted {
public:
  MembraneCallContextHook(kj::Own<CallContextHook>&& inner,
                          kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), reverse(reverse),
        paramsCapTable(*this->policy, reverse),
        resultsCapTable(*this->policy, reverse) {}

  AnyPointer::Reader getParams() override {
    KJ_REQUIRE(!releasedParams);
    KJ_IF_SOME(p, params) {
      return p;
    } else {
      auto result = paramsCapTable.imbue(inner->getParams());
      params = result;
      return result;
    }
  }

  void releaseParams() override {
    // Note that releaseParams() is idempotent -- it can be called multiple times.
    releasedParams = true;
    inner->releaseParams();
  }